

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O1

block * gen_llc(compiler_state_t *cstate)

{
  int iVar1;
  uint uVar2;
  block *pbVar3;
  block *b1;
  slist *psVar4;
  
  iVar1 = cstate->linktype;
  if (iVar1 < 0xb) {
    if (iVar1 == 1) {
      psVar4 = gen_load_absoffsetrel(cstate,&cstate->off_linktype,0,8);
      pbVar3 = (block *)newchunk(cstate,0x120);
      (pbVar3->s).code = 0x25;
      pbVar3->head = pbVar3;
      pbVar3->stmts = psVar4;
      (pbVar3->s).k = 0x5dc;
      pbVar3->sense = (uint)(pbVar3->sense == 0);
      psVar4 = gen_load_absoffsetrel(cstate,&cstate->off_linkpl,0,8);
      b1 = (block *)newchunk(cstate,0x120);
      (b1->s).code = 0x15;
      b1->head = b1;
      b1->stmts = psVar4;
      (b1->s).k = 0xffff;
      b1->sense = (uint)(b1->sense == 0);
      gen_and(pbVar3,b1);
      return b1;
    }
    if ((iVar1 != 6) && (iVar1 != 10)) goto LAB_0010a3b4;
  }
  else {
    uVar2 = iVar1 - 0x69;
    if (uVar2 < 0x3b) {
      if ((0x400000000404001U >> ((ulong)uVar2 & 0x3f) & 1) != 0) goto LAB_0010a2b7;
      if ((ulong)uVar2 == 0x12) {
        pbVar3 = gen_atmtype_abbrev(cstate,0x1f);
        return pbVar3;
      }
    }
    if (iVar1 != 0xb) {
      if (iVar1 == 0xc0) {
LAB_0010a2b7:
        pbVar3 = gen_check_802_11_data_frame(cstate);
        return pbVar3;
      }
LAB_0010a3b4:
      bpf_error(cstate,"\'llc\' not supported for linktype %d");
    }
  }
  psVar4 = (slist *)newchunk(cstate,0x28);
  (psVar4->s).code = 0;
  (psVar4->s).k = 0;
  pbVar3 = (block *)newchunk(cstate,0x120);
  (pbVar3->s).code = 0x15;
  pbVar3->head = pbVar3;
  pbVar3->stmts = psVar4;
  return pbVar3;
}

Assistant:

struct block *
gen_llc(compiler_state_t *cstate)
{
	struct block *b0, *b1;

	switch (cstate->linktype) {

	case DLT_EN10MB:
		/*
		 * We check for an Ethernet type field less than
		 * 1500, which means it's an 802.3 length field.
		 */
		b0 = gen_cmp_gt(cstate, OR_LINKTYPE, 0, BPF_H, ETHERMTU);
		gen_not(b0);

		/*
		 * Now check for the purported DSAP and SSAP not being
		 * 0xFF, to rule out NetWare-over-802.3.
		 */
		b1 = gen_cmp(cstate, OR_LLC, 0, BPF_H, (bpf_int32)0xFFFF);
		gen_not(b1);
		gen_and(b0, b1);
		return b1;

	case DLT_SUNATM:
		/*
		 * We check for LLC traffic.
		 */
		b0 = gen_atmtype_abbrev(cstate, A_LLC);
		return b0;

	case DLT_IEEE802:	/* Token Ring */
		/*
		 * XXX - check for LLC frames.
		 */
		return gen_true(cstate);

	case DLT_FDDI:
		/*
		 * XXX - check for LLC frames.
		 */
		return gen_true(cstate);

	case DLT_ATM_RFC1483:
		/*
		 * For LLC encapsulation, these are defined to have an
		 * 802.2 LLC header.
		 *
		 * For VC encapsulation, they don't, but there's no
		 * way to check for that; the protocol used on the VC
		 * is negotiated out of band.
		 */
		return gen_true(cstate);

	case DLT_IEEE802_11:
	case DLT_PRISM_HEADER:
	case DLT_IEEE802_11_RADIO:
	case DLT_IEEE802_11_RADIO_AVS:
	case DLT_PPI:
		/*
		 * Check that we have a data frame.
		 */
		b0 = gen_check_802_11_data_frame(cstate);
		return b0;

	default:
		bpf_error(cstate, "'llc' not supported for linktype %d", cstate->linktype);
		/* NOTREACHED */
	}
}